

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O2

void __thiscall
QSingleShotTimer::QSingleShotTimer
          (QSingleShotTimer *this,Duration interval,TimerType timerType,QObject *r,
          QSlotObjectBase *slotObj)

{
  int signal_index;
  QObject *pQVar1;
  long in_FS_OFFSET;
  QObject *local_38;
  
  local_38 = *(QObject **)(in_FS_OFFSET + 0x28);
  pQVar1 = &QAbstractEventDispatcher::instance((QThread *)0x0)->super_QObject;
  QObject::QObject((QObject *)this,pQVar1);
  *(undefined ***)this = &PTR_metaObject_00666020;
  *(undefined4 *)(this + 0x10) = 0;
  signal_index = QMetaObjectPrivate::signalOffset(&staticMetaObject);
  pQVar1 = r;
  if (r == (QObject *)0x0) {
    pQVar1 = (QObject *)this;
  }
  QObjectPrivate::connectImpl
            ((QObjectPrivate *)&stack0xffffffffffffffc0,(QObject *)this,signal_index,pQVar1,
             (void **)0x0,slotObj,0,(int *)0x0,&staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  startTimerForReceiver(this,interval,timerType,r);
  if (*(QObject **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSingleShotTimer::QSingleShotTimer(Duration interval, Qt::TimerType timerType,
                                   const QObject *r, QtPrivate::QSlotObjectBase *slotObj)
    : QObject(QAbstractEventDispatcher::instance())
{
    int signal_index = QMetaObjectPrivate::signalOffset(&staticMetaObject);
    Q_ASSERT(QMetaObjectPrivate::signal(&staticMetaObject, signal_index).name() == "timeout");
    QObjectPrivate::connectImpl(this, signal_index, r ? r : this, nullptr, slotObj,
                                Qt::AutoConnection, nullptr, &staticMetaObject);

    startTimerForReceiver(interval, timerType, r);
}